

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O1

bool __thiscall CConnman::InitBinds(CConnman *this,Options *options)

{
  CService *pCVar1;
  pointer pNVar2;
  pointer pNVar3;
  bool bVar4;
  uint16_t uVar5;
  CService *pCVar6;
  pointer pNVar7;
  long in_FS_OFFSET;
  bool bVar8;
  in_addr inaddr_any;
  CService ipv4_any;
  CService ipv6_any;
  in_addr local_8c;
  anon_union_16_3_a3f0114d_for___in6_u local_88;
  uint local_78;
  direct_or_indirect local_58;
  uint local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar6 = (options->vBinds).super__Vector_base<CService,_std::allocator<CService>_>._M_impl.
           super__Vector_impl_data._M_start;
  pCVar1 = (options->vBinds).super__Vector_base<CService,_std::allocator<CService>_>._M_impl.
           super__Vector_impl_data._M_finish;
  bVar8 = pCVar6 == pCVar1;
  if (bVar8) {
LAB_001b0a09:
    pNVar2 = (options->vWhiteBinds).
             super__Vector_base<NetWhitebindPermissions,_std::allocator<NetWhitebindPermissions>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pNVar3 = (options->vWhiteBinds).
             super__Vector_base<NetWhitebindPermissions,_std::allocator<NetWhitebindPermissions>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    bVar8 = pNVar2 == pNVar3;
    if (!bVar8) {
      bVar4 = Bind(this,&pNVar2->m_service,1,(pNVar2->super_NetPermissions).m_flags);
      if (bVar4) {
        do {
          pNVar7 = pNVar2 + 1;
          bVar8 = pNVar7 == pNVar3;
          if (bVar8) goto LAB_001b0a6a;
          bVar4 = Bind(this,&pNVar2[1].m_service,1,(pNVar7->super_NetPermissions).m_flags);
          pNVar2 = pNVar7;
        } while (bVar4);
      }
      if (!bVar8) goto LAB_001b0b79;
    }
LAB_001b0a6a:
    pCVar6 = (options->onion_binds).super__Vector_base<CService,_std::allocator<CService>_>._M_impl.
             super__Vector_impl_data._M_start;
    pCVar1 = (options->onion_binds).super__Vector_base<CService,_std::allocator<CService>_>._M_impl.
             super__Vector_impl_data._M_finish;
    bVar8 = pCVar6 == pCVar1;
    if (!bVar8) {
      bVar4 = Bind(this,pCVar6,3,None);
      if (bVar4) {
        do {
          pCVar6 = pCVar6 + 1;
          bVar8 = pCVar6 == pCVar1;
          if (bVar8) goto LAB_001b0ac7;
          bVar4 = Bind(this,pCVar6,3,None);
        } while (bVar4);
      }
      if (!bVar8) goto LAB_001b0b79;
    }
LAB_001b0ac7:
    if (options->bind_on_any == true) {
      local_88._0_8_ = (void *)0x0;
      local_88._8_8_ = 0;
      uVar5 = GetListenPort();
      CService::CService((CService *)&local_58.indirect_contents,(in6_addr *)&local_88,uVar5);
      Bind(this,(CService *)&local_58.indirect_contents,0,None);
      local_8c.s_addr = 0;
      uVar5 = GetListenPort();
      CService::CService((CService *)&local_88,&local_8c,uVar5);
      bVar8 = Bind(this,(CService *)&local_88,1,None);
      if (0x10 < local_78) {
        free((void *)local_88._0_8_);
        local_88._0_8_ = (void *)0x0;
      }
      if (0x10 < local_48) {
        free(local_58.indirect_contents.indirect);
        local_58.indirect_contents.indirect = (char *)0x0;
      }
      if (!bVar8) goto LAB_001b0b79;
    }
    bVar8 = true;
  }
  else {
    bVar4 = Bind(this,pCVar6,1,None);
    if (bVar4) {
      do {
        pCVar6 = pCVar6 + 1;
        bVar8 = pCVar6 == pCVar1;
        if (bVar8) goto LAB_001b0a09;
        bVar4 = Bind(this,pCVar6,1,None);
      } while (bVar4);
    }
    if (bVar8) goto LAB_001b0a09;
LAB_001b0b79:
    bVar8 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return bVar8;
}

Assistant:

bool CConnman::InitBinds(const Options& options)
{
    for (const auto& addrBind : options.vBinds) {
        if (!Bind(addrBind, BF_REPORT_ERROR, NetPermissionFlags::None)) {
            return false;
        }
    }
    for (const auto& addrBind : options.vWhiteBinds) {
        if (!Bind(addrBind.m_service, BF_REPORT_ERROR, addrBind.m_flags)) {
            return false;
        }
    }
    for (const auto& addr_bind : options.onion_binds) {
        if (!Bind(addr_bind, BF_REPORT_ERROR | BF_DONT_ADVERTISE, NetPermissionFlags::None)) {
            return false;
        }
    }
    if (options.bind_on_any) {
        // Don't consider errors to bind on IPv6 "::" fatal because the host OS
        // may not have IPv6 support and the user did not explicitly ask us to
        // bind on that.
        const CService ipv6_any{in6_addr(IN6ADDR_ANY_INIT), GetListenPort()}; // ::
        Bind(ipv6_any, BF_NONE, NetPermissionFlags::None);

        struct in_addr inaddr_any;
        inaddr_any.s_addr = htonl(INADDR_ANY);
        const CService ipv4_any{inaddr_any, GetListenPort()}; // 0.0.0.0
        if (!Bind(ipv4_any, BF_REPORT_ERROR, NetPermissionFlags::None)) {
            return false;
        }
    }
    return true;
}